

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_util.cpp
# Opt level: O0

void duckdb::regexp_util::ParseRegexOptions(string *options,Options *result,bool *global_replace)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 *puVar3;
  undefined8 uVar4;
  undefined1 *in_RDX;
  Options *in_RSI;
  ulong in_RDI;
  idx_t i;
  string *in_stack_ffffffffffffff48;
  InvalidInputException *in_stack_ffffffffffffff50;
  allocator in_stack_ffffffffffffff87;
  string *in_stack_ffffffffffffff88;
  InvalidInputException *in_stack_ffffffffffffff90;
  allocator local_41;
  string local_40 [32];
  ulong local_20;
  undefined1 *local_18;
  Options *local_10;
  ulong local_8;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    uVar1 = local_20;
    uVar2 = ::std::__cxx11::string::size();
    if (uVar2 <= uVar1) {
      return;
    }
    puVar3 = (undefined1 *)::std::__cxx11::string::operator[](local_8);
    switch(*puVar3) {
    case 9:
    case 10:
    case 0x20:
      break;
    default:
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff88,"Unrecognized Regex option %c",
                 (allocator *)&stack0xffffffffffffff87);
      ::std::__cxx11::string::operator[](local_8);
      InvalidInputException::InvalidInputException<char>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(char)in_stack_ffffffffffffff87
                );
      __cxa_throw(uVar4,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    case 99:
      duckdb_re2::RE2::Options::set_case_sensitive(local_10,true);
      break;
    case 0x67:
      if (local_18 == (undefined1 *)0x0) {
        uVar4 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_40,"Option \'g\' (global replace) is only valid for regexp_replace",
                   &local_41);
        InvalidInputException::InvalidInputException
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        __cxa_throw(uVar4,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      *local_18 = 1;
      break;
    case 0x69:
      duckdb_re2::RE2::Options::set_case_sensitive(local_10,false);
      break;
    case 0x6c:
      duckdb_re2::RE2::Options::set_literal(local_10,true);
      break;
    case 0x6d:
    case 0x6e:
    case 0x70:
      duckdb_re2::RE2::Options::set_dot_nl(local_10,false);
      break;
    case 0x73:
      duckdb_re2::RE2::Options::set_dot_nl(local_10,true);
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void ParseRegexOptions(const string &options, duckdb_re2::RE2::Options &result, bool *global_replace) {
	for (idx_t i = 0; i < options.size(); i++) {
		switch (options[i]) {
		case 'c':
			// case-sensitive matching
			result.set_case_sensitive(true);
			break;
		case 'i':
			// case-insensitive matching
			result.set_case_sensitive(false);
			break;
		case 'l':
			// literal matching
			result.set_literal(true);
			break;
		case 'm':
		case 'n':
		case 'p':
			// newline-sensitive matching
			result.set_dot_nl(false);
			break;
		case 's':
			// non-newline-sensitive matching
			result.set_dot_nl(true);
			break;
		case 'g':
			// global replace, only available for regexp_replace
			if (global_replace) {
				*global_replace = true;
			} else {
				throw InvalidInputException("Option 'g' (global replace) is only valid for regexp_replace");
			}
			break;
		case ' ':
		case '\t':
		case '\n':
			// ignore whitespace
			break;
		default:
			throw InvalidInputException("Unrecognized Regex option %c", options[i]);
		}
	}
}